

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Input::advance(Input *this,size_t numBytes)

{
  size_t sVar1;
  char *pcVar2;
  char *end;
  ArrayPtr<const_char> AVar3;
  char *local_40;
  size_t local_38;
  Fault local_20;
  Fault f;
  size_t numBytes_local;
  Input *this_local;
  
  f.exception = (Exception *)numBytes;
  sVar1 = kj::ArrayPtr<const_char>::size(&this->wrapped);
  if (numBytes <= sVar1) {
    pcVar2 = kj::ArrayPtr<const_char>::begin(&this->wrapped);
    pcVar2 = pcVar2 + (long)f.exception;
    end = kj::ArrayPtr<const_char>::end(&this->wrapped);
    AVar3 = kj::arrayPtr<char_const>(pcVar2,end);
    local_40 = AVar3.ptr;
    (this->wrapped).ptr = local_40;
    local_38 = AVar3.size_;
    (this->wrapped).size_ = local_38;
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x21f,FAILED,"numBytes <= wrapped.size()","\"JSON message ends prematurely.\"",
             (char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

void advance(size_t numBytes = 1) {
    KJ_REQUIRE(numBytes <= wrapped.size(), "JSON message ends prematurely.");
    wrapped = kj::arrayPtr(wrapped.begin() + numBytes, wrapped.end());
  }